

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<12,_5,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  long lVar1;
  float fVar2;
  float fVar3;
  Vector<float,_3> res;
  undefined8 local_38;
  float local_30;
  undefined8 local_28;
  float local_20;
  int aiStack_18 [6];
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    fVar2 = evalCtx->in[0].m_data[0] + -1.0;
    fVar3 = evalCtx->in[1].m_data[0] + -1.0;
    local_20 = evalCtx->in[1].m_data[1] + -1.0 + evalCtx->in[0].m_data[1] + -1.0;
  }
  else {
    fVar2 = -1.1;
    fVar3 = 0.0;
    local_20 = -2.2;
  }
  local_28 = CONCAT44(fVar3,fVar2);
  local_38 = CONCAT44(fVar3,fVar2);
  local_30 = local_20;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  lVar1 = 0;
  do {
    res.m_data[lVar1] =
         *(float *)((long)&local_28 + lVar1 * 4) + *(float *)((long)&local_38 + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar1]] = res.m_data[lVar1 + -2];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(decrement(in0)) + reduceToVec3(decrement(in0));
	}